

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::testEnded(Runner *this,AssertionResult *result)

{
  bool bVar1;
  OfType OVar2;
  reference ppSVar3;
  reference pAVar4;
  IReporter *pIVar5;
  __normal_iterator<Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
  local_120;
  __normal_iterator<const_Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
  local_118;
  const_iterator itEnd_1;
  __normal_iterator<const_Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
  local_108;
  const_iterator it_1;
  AssertionResult local_f0;
  __normal_iterator<Catch::ScopedInfo_**,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
  local_38;
  __normal_iterator<Catch::ScopedInfo_*const_*,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
  local_30;
  const_iterator itEnd;
  __normal_iterator<Catch::ScopedInfo_*const_*,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
  local_20;
  const_iterator it;
  AssertionResult *result_local;
  Runner *this_local;
  
  it._M_current = (ScopedInfo **)result;
  OVar2 = AssertionResult::getResultType(result);
  if (OVar2 == Ok) {
    (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
  }
  else {
    bVar1 = AssertionResult::isOk((AssertionResult *)it._M_current);
    if (!bVar1) {
      (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
      itEnd._M_current =
           (ScopedInfo **)
           std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>::begin
                     (&this->m_scopedInfos);
      __gnu_cxx::
      __normal_iterator<Catch::ScopedInfo*const*,std::vector<Catch::ScopedInfo*,std::allocator<Catch::ScopedInfo*>>>
      ::__normal_iterator<Catch::ScopedInfo**>
                ((__normal_iterator<Catch::ScopedInfo*const*,std::vector<Catch::ScopedInfo*,std::allocator<Catch::ScopedInfo*>>>
                  *)&local_20,
                 (__normal_iterator<Catch::ScopedInfo_**,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
                  *)&itEnd);
      local_38._M_current =
           (ScopedInfo **)
           std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>::end
                     (&this->m_scopedInfos);
      __gnu_cxx::
      __normal_iterator<Catch::ScopedInfo*const*,std::vector<Catch::ScopedInfo*,std::allocator<Catch::ScopedInfo*>>>
      ::__normal_iterator<Catch::ScopedInfo**>
                ((__normal_iterator<Catch::ScopedInfo*const*,std::vector<Catch::ScopedInfo*,std::allocator<Catch::ScopedInfo*>>>
                  *)&local_30,&local_38);
      while (bVar1 = __gnu_cxx::operator!=(&local_20,&local_30), bVar1) {
        pIVar5 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<Catch::ScopedInfo_*const_*,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
                  ::operator*(&local_20);
        ScopedInfo::buildResult(&local_f0,*ppSVar3,&this->m_lastAssertionInfo);
        (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar5,&local_f0);
        AssertionResult::~AssertionResult(&local_f0);
        __gnu_cxx::
        __normal_iterator<Catch::ScopedInfo_*const_*,_std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>_>
        ::operator++(&local_20);
      }
      itEnd_1._M_current =
           (AssertionResult *)
           std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::begin
                     (&this->m_assertionResults);
      __gnu_cxx::
      __normal_iterator<Catch::AssertionResult_const*,std::vector<Catch::AssertionResult,std::allocator<Catch::AssertionResult>>>
      ::__normal_iterator<Catch::AssertionResult*>
                ((__normal_iterator<Catch::AssertionResult_const*,std::vector<Catch::AssertionResult,std::allocator<Catch::AssertionResult>>>
                  *)&local_108,
                 (__normal_iterator<Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
                  *)&itEnd_1);
      local_120._M_current =
           (AssertionResult *)
           std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::end
                     (&this->m_assertionResults);
      __gnu_cxx::
      __normal_iterator<Catch::AssertionResult_const*,std::vector<Catch::AssertionResult,std::allocator<Catch::AssertionResult>>>
      ::__normal_iterator<Catch::AssertionResult*>
                ((__normal_iterator<Catch::AssertionResult_const*,std::vector<Catch::AssertionResult,std::allocator<Catch::AssertionResult>>>
                  *)&local_118,&local_120);
      while (bVar1 = __gnu_cxx::operator!=(&local_108,&local_118), bVar1) {
        pIVar5 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
        pAVar4 = __gnu_cxx::
                 __normal_iterator<const_Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
                 ::operator*(&local_108);
        (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar5,pAVar4);
        __gnu_cxx::
        __normal_iterator<const_Catch::AssertionResult_*,_std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>_>
        ::operator++(&local_108);
      }
      std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::clear
                (&this->m_assertionResults);
    }
  }
  OVar2 = AssertionResult::getResultType((AssertionResult *)it._M_current);
  if (OVar2 == Info) {
    std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::push_back
              (&this->m_assertionResults,(value_type *)it._M_current);
  }
  else {
    pIVar5 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
    (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar5,it._M_current);
  }
  return;
}

Assistant:

virtual void testEnded( const AssertionResult& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;

                {
                    std::vector<ScopedInfo*>::const_iterator it = m_scopedInfos.begin();
                    std::vector<ScopedInfo*>::const_iterator itEnd = m_scopedInfos.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( (*it)->buildResult( m_lastAssertionInfo ) );
                }
                {
                    std::vector<AssertionResult>::const_iterator it = m_assertionResults.begin();
                    std::vector<AssertionResult>::const_iterator itEnd = m_assertionResults.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( *it );
                }
                m_assertionResults.clear();
            }

            if( result.getResultType() == ResultWas::Info )
                m_assertionResults.push_back( result );
            else
                m_reporter->Result( result );
        }